

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::SkipFallback
          (EpsCopyInputStream *this,char *ptr,int size)

{
  LogMessage *other;
  char *pcVar1;
  int iVar2;
  int iVar3;
  LogFinisher local_69;
  LogMessage local_68;
  
  iVar2 = (*(int *)&this->buffer_end_ - (int)ptr) + 0x10;
  while( true ) {
    iVar3 = size - iVar2;
    if (iVar3 == 0 || size < iVar2) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/parse_context.h"
                 ,0x146);
      other = LogMessage::operator<<(&local_68,"CHECK failed: size > chunk_size: ");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage(&local_68);
    }
    if (((this->next_chunk_ == (char *)0x0) || (this->limit_ < 0x11)) ||
       (pcVar1 = Next(this), pcVar1 == (char *)0x0)) break;
    iVar2 = (*(int *)&this->buffer_end_ - (int)(pcVar1 + 0x10)) + 0x10;
    size = iVar3;
    if (iVar3 <= iVar2) {
      return pcVar1 + 0x10 + iVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* EpsCopyInputStream::SkipFallback(const char* ptr, int size) {
  return AppendSize(ptr, size, [](const char* /*p*/, int /*s*/) {});
}